

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O2

bool waitForWidgetMapped(QWidget *widget,int timeout)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  timespec ts;
  timespec local_48;
  undefined8 local_38;
  undefined8 local_30;
  anon_class_8_1_722b4b82 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0x8000000000000000;
  local_30 = 0x8000000000000000;
  local_28.widget = widget;
  QElapsedTimer::start();
  while( true ) {
    bVar1 = waitForWidgetMapped::anon_class_8_1_722b4b82::operator()(&local_28);
    if (bVar1) break;
    iVar2 = QElapsedTimer::elapsed();
    if (999 < iVar2) break;
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    local_48.tv_sec = 0;
    local_48.tv_nsec = 10000000;
    nanosleep(&local_48,(timespec *)0x0);
  }
  waitForWidgetMapped::anon_class_8_1_722b4b82::operator()(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool waitForWidgetMapped(QWidget *widget, int timeout = 1000)
{
    enum { TimeOutMs = 10 };
    auto isMapped = [widget](){
        return widget->windowHandle() && widget->windowHandle()->isVisible();
    };

    QElapsedTimer timer;
    timer.start();
    while (!isMapped()) {
        const int remaining = timeout - int(timer.elapsed());
        if (remaining <= 0)
            break;
        QCoreApplication::processEvents(QEventLoop::AllEvents, remaining);
        QCoreApplication::sendPostedEvents();
#if defined(Q_OS_WIN)
        Sleep(uint(TimeOutMs));
#else
        struct timespec ts = { TimeOutMs / 1000, (TimeOutMs % 1000) * 1000 * 1000 };
        nanosleep(&ts, nullptr);
#endif
    }
    return isMapped();
}